

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscHelper.cpp
# Opt level: O3

void adios2::core::engine::ssc::DeserializeVariable
               (Buffer *input,ShapeID shapeId,uint64_t *pos,BlockInfo *b,IO *io,bool regIO,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>_>
               *StructDefs)

{
  Dims *this;
  Dims *this_00;
  uint64_t uVar1;
  byte bVar2;
  size_type sVar3;
  unsigned_long uVar4;
  unsigned_long *puVar5;
  BlockInfo *pBVar6;
  uint8_t *puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  Variable *pVVar9;
  long lVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  unsigned_long *puVar12;
  iterator iVar13;
  long *plVar14;
  uint64_t uVar15;
  pointer puVar16;
  size_type *psVar17;
  _Alloc_hider _Var18;
  undefined7 in_register_00000089;
  ulong uVar19;
  size_t __n;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<unsigned_long> __l_06;
  initializer_list<unsigned_long> __l_07;
  initializer_list<unsigned_long> __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<unsigned_long> __l_10;
  initializer_list<unsigned_long> __l_11;
  initializer_list<unsigned_long> __l_12;
  initializer_list<unsigned_long> __l_13;
  vector<char,_std::allocator<char>_> structDefChar;
  Dims vStart;
  Dims vShape_15;
  Dims vStart_15;
  vector<char,_std::allocator<char>_> name;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_70;
  BlockInfo *local_58;
  undefined4 local_4c;
  vector<char,_std::allocator<char>_> local_48;
  
  local_4c = (undefined4)CONCAT71(in_register_00000089,regIO);
  b->shapeId = shapeId;
  uVar19 = (ulong)input->m_Buffer[*pos];
  *pos = *pos + 1;
  std::vector<char,_std::allocator<char>_>::vector(&local_48,uVar19,(allocator_type *)&local_c8);
  memcpy(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,input->m_Buffer + *pos,uVar19);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::
  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((string *)&local_c8,
             local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish);
  local_58 = b;
  std::__cxx11::string::operator=((string *)b,(string *)&local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  pBVar6 = local_58;
  uVar15 = *pos;
  uVar1 = uVar15 + uVar19;
  *pos = uVar1;
  puVar7 = input->m_Buffer;
  bVar2 = puVar7[uVar1];
  local_58->type = (uint)bVar2;
  uVar15 = uVar15 + uVar19 + 1;
  *pos = uVar15;
  if (bVar2 == Struct) {
    uVar19 = (ulong)puVar7[uVar1 + 1];
    *pos = uVar1 + 2;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&local_e8,uVar19,(allocator_type *)&local_c8);
    memcpy(local_e8._M_dataplus._M_p,input->m_Buffer + *pos,uVar19);
    *pos = *pos + uVar19;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::
    _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              ((string *)&local_c8,local_e8._M_dataplus._M_p,local_e8._M_string_length);
    std::__cxx11::string::operator=((string *)&pBVar6->structDef,(string *)&local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    uVar15 = *pos;
    puVar7 = input->m_Buffer;
  }
  pBVar6 = local_58;
  local_58->elementSize = *(size_t *)(puVar7 + uVar15);
  uVar1 = *pos;
  *pos = uVar1 + 8;
  bVar2 = puVar7[uVar1 + 8];
  uVar19 = (ulong)bVar2;
  *pos = uVar1 + 9;
  this = &local_58->shape;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this,uVar19);
  this_00 = &pBVar6->start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,uVar19);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&pBVar6->count,uVar19);
  __n = (ulong)bVar2 * 8;
  memcpy((pBVar6->shape).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start,input->m_Buffer + *pos,__n);
  uVar1 = *pos;
  *pos = uVar1 + __n;
  memcpy((pBVar6->start).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start,input->m_Buffer + uVar1 + __n,__n);
  uVar1 = *pos;
  *pos = uVar1 + __n;
  memcpy((pBVar6->count).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start,input->m_Buffer + uVar1 + __n,__n);
  uVar1 = *pos;
  *pos = __n + uVar1;
  puVar7 = input->m_Buffer;
  pBVar6->bufferStart = *(size_t *)(puVar7 + __n + uVar1);
  uVar1 = *pos;
  *pos = uVar1 + 8;
  pBVar6->bufferCount = *(size_t *)(puVar7 + uVar1 + 8);
  uVar1 = *pos;
  *pos = uVar1 + 8;
  uVar19 = (ulong)puVar7[uVar1 + 8];
  *pos = uVar1 + 9;
  std::vector<char,_std::allocator<char>_>::resize(&pBVar6->value,uVar19);
  if (uVar19 != 0) {
    memcpy((pBVar6->value).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start,input->m_Buffer + *pos,uVar19);
    *pos = *pos + uVar19;
  }
  pBVar6 = local_58;
  if ((char)local_4c == '\0') goto LAB_00132ad8;
  switch(local_58->type) {
  case Int8:
    pVVar9 = adios2::core::IO::InquireVariable<signed_char>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    break;
  case Int16:
    pVVar9 = adios2::core::IO::InquireVariable<short>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<short>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<short>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_08._M_len = 1;
      __l_08._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_08,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<short>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<short>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case Int32:
    pVVar9 = adios2::core::IO::InquireVariable<int>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<int>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<int>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_04._M_len = 1;
      __l_04._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_04,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<int>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<int>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case Int64:
    pVVar9 = adios2::core::IO::InquireVariable<long>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<long>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<long>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_05._M_len = 1;
      __l_05._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_05,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<long>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<long>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case UInt8:
    pVVar9 = adios2::core::IO::InquireVariable<unsigned_char>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<unsigned_char>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<unsigned_char>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_01._M_len = 1;
      __l_01._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_01,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<unsigned_char>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<unsigned_char>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case UInt16:
    pVVar9 = adios2::core::IO::InquireVariable<unsigned_short>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<unsigned_short>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<unsigned_short>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_09._M_len = 1;
      __l_09._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_09,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<unsigned_short>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<unsigned_short>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case UInt32:
    pVVar9 = adios2::core::IO::InquireVariable<unsigned_int>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<unsigned_int>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<unsigned_int>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_11._M_len = 1;
      __l_11._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_11,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<unsigned_int>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<unsigned_int>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case UInt64:
    pVVar9 = adios2::core::IO::InquireVariable<unsigned_long>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<unsigned_long>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<unsigned_long>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_06._M_len = 1;
      __l_06._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_06,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<unsigned_long>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<unsigned_long>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case Float:
    pVVar9 = adios2::core::IO::InquireVariable<float>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<float>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<float>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_13._M_len = 1;
      __l_13._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_13,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<float>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<float>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case Double:
    pVVar9 = adios2::core::IO::InquireVariable<double>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<double>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<double>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_03._M_len = 1;
      __l_03._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_03,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<double>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<double>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case LongDouble:
    pVVar9 = adios2::core::IO::InquireVariable<long_double>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<long_double>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<long_double>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_12._M_len = 1;
      __l_12._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_12,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<long_double>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<long_double>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case FloatComplex:
    pVVar9 = adios2::core::IO::InquireVariable<std::complex<float>>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<std::complex<float>>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<std::complex<float>>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_00,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<std::complex<float>>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<std::complex<float>>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case DoubleComplex:
    pVVar9 = adios2::core::IO::InquireVariable<std::complex<double>>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<std::complex<double>>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<std::complex<double>>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_02._M_len = 1;
      __l_02._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_02,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<std::complex<double>>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<std::complex<double>>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case String:
    pVVar9 = adios2::core::IO::InquireVariable<std::__cxx11::string>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<std::__cxx11::string>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<std::__cxx11::string>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l_10._M_len = 1;
      __l_10._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_10,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<std::__cxx11::string>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<std::__cxx11::string>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case Char:
    pVVar9 = adios2::core::IO::InquireVariable<char>((string *)io);
    if (pVVar9 != (Variable *)0x0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_c8,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = (size_type *)(local_c8._M_string_length + -8);
      _Var18._M_p = local_c8._M_dataplus._M_p;
      if (local_c8._M_dataplus._M_p < psVar17 &&
          local_c8._M_dataplus._M_p != (pointer)local_c8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
      psVar17 = (size_type *)(local_e8._M_string_length + -8);
      _Var18._M_p = local_e8._M_dataplus._M_p;
      if (local_e8._M_dataplus._M_p < psVar17 &&
          local_e8._M_dataplus._M_p != (pointer)local_e8._M_string_length) {
        do {
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)((long)_Var18._M_p + 8);
          sVar3 = *(size_type *)_Var18._M_p;
          *(size_type *)_Var18._M_p = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          _Var18._M_p = (pointer)paVar8;
        } while (paVar8 < psVar17);
      }
    }
    switch(pBVar6->shapeId) {
    case GlobalValue:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<char>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case GlobalArray:
      adios2::core::IO::DefineVariable<char>
                ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
                 SUB81(&local_e8,0));
      break;
    case LocalValue:
      local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l,
                 (allocator_type *)&local_88);
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      adios2::core::IO::DefineVariable<char>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_a8,0));
      goto LAB_00132a8a;
    case LocalArray:
      local_128._M_dataplus._M_p = (pointer)0x0;
      local_128._M_string_length = 0;
      local_128.field_2._M_allocated_capacity = 0;
      local_108.field_2._M_allocated_capacity = 0;
      local_108._M_dataplus._M_p = (pointer)0x0;
      local_108._M_string_length = 0;
      adios2::core::IO::DefineVariable<char>
                ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
                 SUB81(&local_e8,0));
      goto LAB_00132a9c;
    }
    goto switchD_00131164_caseD_3;
  case Struct:
    lVar10 = adios2::core::IO::InquireStructVariable((string *)io);
    if (lVar10 != 0) goto LAB_00132ad8;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_70,this_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_88,this);
    if (*(int *)(io + 0x58) != 0) {
      psVar17 = local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                  .super__Vector_impl_data._M_start;
      if (local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start < psVar17 &&
          local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar8->_M_allocated_capacity + 1);
          sVar3 = paVar8->_M_allocated_capacity;
          paVar8->_M_allocated_capacity = *psVar17;
          *psVar17 = sVar3;
          psVar17 = psVar17 + -1;
          paVar8 = paVar11;
        } while (paVar11 < psVar17);
      }
      puVar16 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish + -1;
      puVar5 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start < puVar16 &&
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          puVar12 = puVar5 + 1;
          uVar4 = *puVar5;
          *puVar5 = *puVar16;
          *puVar16 = uVar4;
          puVar16 = puVar16 + -1;
          puVar5 = puVar12;
        } while (puVar12 < puVar16);
      }
    }
    if (pBVar6->shapeId == GlobalArray) {
      iVar13 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&StructDefs->_M_h,&pBVar6->structDef);
      if (iVar13.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_true>
          ._M_cur == (__node_type *)0x0) {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Engine","");
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"SscHelper","");
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"DeserializeVariable","");
        std::operator+(&local_a8,"struct type ",&pBVar6->structDef);
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_a8);
        psVar17 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_108.field_2._M_allocated_capacity = *psVar17;
          local_108.field_2._8_8_ = plVar14[3];
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        }
        else {
          local_108.field_2._M_allocated_capacity = *psVar17;
          local_108._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_108._M_string_length = plVar14[1];
        *plVar14 = (long)psVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        helper::Throw<std::runtime_error>(&local_c8,&local_e8,&local_128,&local_108,-1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p);
        }
      }
      else {
        adios2::core::IO::DefineStructVariable
                  ((string *)io,(StructDefinition *)pBVar6,
                   (vector *)
                   ((long)iVar13.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::StructDefinition>,_true>
                          ._M_cur + 0x28),(vector *)&local_88,(vector *)&local_70,
                   SUB81((vector *)&local_88,0));
      }
    }
    _Var18._M_p = (pointer)local_70.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start;
    if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
      _Var18._M_p = (pointer)local_70.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
    }
    goto LAB_00132ace;
  default:
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Engine","");
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"SscHelper","");
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"DeserializeVariable","");
    local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,"unknown variable data type","");
    helper::Throw<std::runtime_error>(&local_c8,&local_e8,&local_128,&local_108,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p);
    }
    _Var18._M_p = local_c8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p == &local_c8.field_2) goto LAB_00132ad8;
    goto LAB_00132ad3;
  }
  switch(pBVar6->shapeId) {
  case GlobalValue:
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_108.field_2._M_allocated_capacity = 0;
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    adios2::core::IO::DefineVariable<signed_char>
              ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
               SUB81(&local_a8,0));
    goto LAB_00132a8a;
  case GlobalArray:
    adios2::core::IO::DefineVariable<signed_char>
              ((string *)io,(vector *)pBVar6,(vector *)&local_e8,(vector *)&local_c8,
               SUB81(&local_e8,0));
    break;
  case LocalValue:
    local_70.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xfffffffffffffffd;
    __l_07._M_len = 1;
    __l_07._M_array = (iterator)&local_70;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_128,__l_07,
               (allocator_type *)&local_88);
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    local_108.field_2._M_allocated_capacity = 0;
    local_a8.field_2._M_allocated_capacity = 0;
    local_a8._M_dataplus._M_p = (pointer)0x0;
    local_a8._M_string_length = 0;
    adios2::core::IO::DefineVariable<signed_char>
              ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
               SUB81(&local_a8,0));
LAB_00132a8a:
    if (local_a8._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(local_a8._M_dataplus._M_p);
    }
LAB_00132a9c:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_108._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    break;
  case LocalArray:
    local_128._M_dataplus._M_p = (pointer)0x0;
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_108.field_2._M_allocated_capacity = 0;
    local_108._M_dataplus._M_p = (pointer)0x0;
    local_108._M_string_length = 0;
    adios2::core::IO::DefineVariable<signed_char>
              ((string *)io,(vector *)pBVar6,(vector *)&local_128,(vector *)&local_108,
               SUB81(&local_e8,0));
    goto LAB_00132a9c;
  }
switchD_00131164_caseD_3:
  _Var18._M_p = local_c8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_e8._M_dataplus._M_p);
    _Var18._M_p = local_c8._M_dataplus._M_p;
  }
LAB_00132ace:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var18._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
LAB_00132ad3:
    operator_delete(_Var18._M_p);
  }
LAB_00132ad8:
  if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DeserializeVariable(const Buffer &input, const ShapeID shapeId, uint64_t &pos, BlockInfo &b,
                         IO &io, const bool regIO,
                         std::unordered_map<std::string, StructDefinition> &StructDefs)
{
    b.shapeId = static_cast<ShapeID>(shapeId);

    uint8_t nameSize = input[pos];
    ++pos;

    std::vector<char> name(nameSize);
    std::memcpy(name.data(), input.data(pos), nameSize);
    b.name = std::string(name.begin(), name.end());
    pos += nameSize;

    b.type = static_cast<DataType>(input[pos]);
    ++pos;

    if (b.type == DataType::Struct)
    {
        uint8_t structDefSize = input.value<uint8_t>(pos);
        ++pos;
        std::vector<char> structDefChar(structDefSize);
        std::memcpy(structDefChar.data(), input.data(pos), structDefSize);
        pos += structDefSize;
        b.structDef = std::string(structDefChar.begin(), structDefChar.end());
    }

    b.elementSize = input.value<uint64_t>(pos);
    pos += 8;

    uint8_t shapeSize = input[pos];
    ++pos;
    b.shape.resize(shapeSize);
    b.start.resize(shapeSize);
    b.count.resize(shapeSize);

    std::memcpy(b.shape.data(), input.data(pos), 8 * shapeSize);
    pos += 8 * shapeSize;

    std::memcpy(b.start.data(), input.data(pos), 8 * shapeSize);
    pos += 8 * shapeSize;

    std::memcpy(b.count.data(), input.data(pos), 8 * shapeSize);
    pos += 8 * shapeSize;

    b.bufferStart = input.value<uint64_t>(pos);
    pos += 8;

    b.bufferCount = input.value<uint64_t>(pos);
    pos += 8;

    uint8_t valueSize = input[pos];
    pos++;
    b.value.resize(valueSize);
    if (valueSize > 0)
    {
        std::memcpy(b.value.data(), input.data() + pos, valueSize);
        pos += valueSize;
    }

    if (regIO)
    {
        if (b.type == DataType::Struct)
        {
            auto v = io.InquireStructVariable(b.name);
            if (!v)
            {
                Dims vStart = b.start;
                Dims vShape = b.shape;
                if (io.m_ArrayOrder != ArrayOrdering::RowMajor)
                {
                    std::reverse(vStart.begin(), vStart.end());
                    std::reverse(vShape.begin(), vShape.end());
                }
                if (b.shapeId == ShapeID::GlobalArray)
                {
                    StructDefinition *def = nullptr;
                    auto it = StructDefs.find(b.structDef);
                    if (it != StructDefs.end())
                    {
                        def = &it->second;
                    }
                    if (def == nullptr)
                    {
                        helper::Throw<std::runtime_error>(
                            "Engine", "SscHelper", "DeserializeVariable",
                            "struct type " + b.structDef + " not defined");
                    }
                    else
                    {
                        io.DefineStructVariable(b.name, *def, vShape, vStart, vShape);
                    }
                }
            }
        }
#define declare_type(T)                                                                            \
    else if (b.type == helper::GetDataType<T>())                                                   \
    {                                                                                              \
        auto v = io.InquireVariable<T>(b.name);                                                    \
        if (!v)                                                                                    \
        {                                                                                          \
            Dims vStart = b.start;                                                                 \
            Dims vShape = b.shape;                                                                 \
            if (io.m_ArrayOrder != ArrayOrdering::RowMajor)                                        \
            {                                                                                      \
                std::reverse(vStart.begin(), vStart.end());                                        \
                std::reverse(vShape.begin(), vShape.end());                                        \
            }                                                                                      \
            if (b.shapeId == ShapeID::GlobalValue)                                                 \
            {                                                                                      \
                io.DefineVariable<T>(b.name);                                                      \
            }                                                                                      \
            else if (b.shapeId == ShapeID::GlobalArray)                                            \
            {                                                                                      \
                io.DefineVariable<T>(b.name, vShape, vStart, vShape);                              \
            }                                                                                      \
            else if (b.shapeId == ShapeID::LocalValue)                                             \
            {                                                                                      \
                io.DefineVariable<T>(b.name, {adios2::LocalValueDim});                             \
            }                                                                                      \
            else if (b.shapeId == ShapeID::LocalArray)                                             \
            {                                                                                      \
                io.DefineVariable<T>(b.name, {}, {}, vShape);                                      \
            }                                                                                      \
        }                                                                                          \
    }
        ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
        else
        {
            helper::Throw<std::runtime_error>("Engine", "SscHelper", "DeserializeVariable",
                                              "unknown variable data type");
        }
    }